

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

bool __thiscall
BattleWithLandlord::Str2CardStyle(BattleWithLandlord *this,string *str,CardStyle *style)

{
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  CardStyle *pCVar4;
  undefined8 in_RSI;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_RDI;
  CardStyle x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<CardStyle,_std::allocator<CardStyle>_> *__range1_1;
  vector<CardStyle,_std::allocator<CardStyle>_> res;
  char x;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  CardStyle *in_stack_00000878;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_00000880;
  BattleWithLandlord *in_stack_00000888;
  CardStyle *in_stack_fffffffffffffde8;
  CardStyle *in_stack_fffffffffffffdf0;
  CardStyle *this_00;
  iterator in_stack_fffffffffffffdf8;
  vector<CardStyle,_std::allocator<CardStyle>_> *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 *puVar5;
  int in_stack_fffffffffffffe18;
  Type in_stack_fffffffffffffe1c;
  uint uVar6;
  CardStyle *in_stack_fffffffffffffe20;
  __normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_> local_198;
  undefined1 *local_190;
  CardStyle local_188;
  undefined1 local_118 [24];
  _Base_ptr local_100;
  char local_f1;
  undefined8 local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined8 local_e0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_18;
  byte local_1;
  
  local_18 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) != 0) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8), bVar1))
     || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8),
        bVar1)) {
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar5 = &local_98;
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f53f);
    CardStyle::CardStyle
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,in_RDI,
               (int)((ulong)puVar5 >> 0x20),(int)puVar5);
    CardStyle::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    CardStyle::~CardStyle((CardStyle *)0x11f584);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f591);
    local_1 = 1;
  }
  else {
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f5d1);
    local_e0 = local_18;
    local_e8._M_current = (char *)std::__cxx11::string::begin();
    local_f0 = std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffdf0,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffde8), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_e8);
      local_f1 = *pcVar3;
      in_stack_fffffffffffffe00 =
           (vector<CardStyle,_std::allocator<CardStyle>_> *)
           std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[]((unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
                         *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
      in_stack_fffffffffffffdf8 =
           std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                     (in_stack_fffffffffffffdf8._M_node,(value_type *)in_stack_fffffffffffffdf0);
      local_100 = in_stack_fffffffffffffdf8._M_node;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_e8);
    }
    local_188.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_188.pattern._M_t._M_impl._0_8_ = 0;
    local_188.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188.pattern._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_188.type = PASS;
    local_188.id = 0;
    local_188.len = 0;
    local_188.carry = 0;
    this_00 = &local_188;
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f6d0);
    CardStyle::CardStyle
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,in_RDI,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08);
    GenStrategy(in_stack_00000888,in_stack_00000880,in_stack_00000878);
    CardStyle::~CardStyle((CardStyle *)0x11f724);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f731);
    local_190 = local_118;
    local_198._M_current =
         (CardStyle *)
         std::vector<CardStyle,_std::allocator<CardStyle>_>::begin(in_stack_fffffffffffffde8);
    std::vector<CardStyle,_std::allocator<CardStyle>_>::end
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)in_stack_fffffffffffffde8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                               *)this_00,
                              (__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                               *)in_stack_fffffffffffffde8), bVar1) {
      __gnu_cxx::__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
      ::operator*(&local_198);
      CardStyle::CardStyle(this_00,in_stack_fffffffffffffde8);
      in_stack_fffffffffffffde8 =
           (CardStyle *)
           std::multiset<char,_std::less<char>,_std::allocator<char>_>::size
                     ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f7ad);
      pCVar4 = (CardStyle *)std::__cxx11::string::size();
      bVar1 = in_stack_fffffffffffffde8 == pCVar4;
      if (bVar1) {
        CardStyle::operator=(this_00,in_stack_fffffffffffffde8);
        local_1 = 1;
      }
      uVar6 = (uint)bVar1;
      CardStyle::~CardStyle((CardStyle *)0x11f888);
      if (uVar6 != 0) goto LAB_0011f8b6;
      __gnu_cxx::__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
      ::operator++(&local_198);
    }
    local_1 = 0;
LAB_0011f8b6:
    std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector(in_stack_fffffffffffffe00);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f8d0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BattleWithLandlord::Str2CardStyle(const string &str, CardStyle &style) {
    if (str.empty() || str == "" || str == "pass") {
        style = CardStyle();
        return true;
    }

    multiset<byte> ms;
    for (auto x: str) {
        ms.insert(_name2id[x]);
    }
    auto res = GenStrategy(ms, CardStyle());
    for (auto x: res) {
        if (x.pattern.size() == str.size()) {
            style = x;
            return true;
        }
    }
    return false;
}